

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnOpcode(BinaryReaderIR *this,Opcode opcode)

{
  _Elt_pointer puVar1;
  _Elt_pointer pEVar2;
  _Map_pointer ppEVar3;
  Result RVar4;
  _Elt_pointer pEVar5;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar6;
  pointer *__ptr;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> _Var7;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> local_28;
  
  pEVar5 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  RVar4.enum_ = Ok;
  if (((this->code_metadata_queue_).entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur != pEVar5) &&
     (pEVar5->func == this->current_func_)) {
    puVar1 = (pEVar5->func_queue).
             super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((pEVar5->func_queue).
        super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar1) {
      pEVar2 = (this->code_metadata_queue_).entries.
               super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      std::
      deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
      ::~deque(&pEVar5->func_queue);
      if (pEVar5 == pEVar2 + -1) {
        operator_delete((this->code_metadata_queue_).entries.
                        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first,0x1b8);
        ppEVar3 = (this->code_metadata_queue_).entries.
                  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = ppEVar3 + 1;
        pEVar5 = ppEVar3[1];
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = pEVar5;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = pEVar5 + 5;
      }
      else {
        pEVar5 = (this->code_metadata_queue_).entries.
                 super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = pEVar5;
    }
    else {
      aVar6.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset - 1;
      _Var7._M_head_impl =
           (puVar1->_M_t).
           super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
           .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
      if ((pEVar5->func->loc).field_1.field_1.offset +
          ((_Var7._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1
          .offset == aVar6.offset) {
        ((_Var7._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_len =
             0;
        ((_Var7._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_str =
             (char *)0x0;
        ((_Var7._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.
        offset = aVar6.offset;
        _Var7._M_head_impl =
             (puVar1->_M_t).
             super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
             .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
        (puVar1->_M_t).
        super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>.
        _M_t.
        super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
        .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl =
             (CodeMetadataExpr *)0x0;
        std::
        deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ::pop_front(&pEVar5->func_queue);
        goto LAB_00115b77;
      }
    }
  }
  _Var7._M_head_impl = (CodeMetadataExpr *)0x0;
LAB_00115b77:
  if ((_Var7._M_head_impl != (CodeMetadataExpr *)0x0) &&
     (local_28._M_head_impl = _Var7._M_head_impl,
     RVar4 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_28),
     local_28._M_head_impl != (CodeMetadataExpr *)0x0)) {
    (*((local_28._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr._vptr_Expr[1])();
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result BinaryReaderIR::OnOpcode(Opcode opcode) {
  std::unique_ptr<CodeMetadataExpr> metadata =
      code_metadata_queue_.pop_match(current_func_, GetLocation().offset - 1);
  if (metadata) {
    return AppendExpr(std::move(metadata));
  }
  return Result::Ok;
}